

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int new_node(huffman_code *code)

{
  huffman_tree_node *phVar1;
  int local_24;
  int new_num_entries;
  void *new_tree;
  huffman_code *code_local;
  
  if (code->numallocatedentries == code->numentries) {
    local_24 = 0x100;
    if (0 < code->numentries) {
      local_24 = code->numentries << 1;
    }
    phVar1 = (huffman_tree_node *)realloc(code->tree,(long)local_24 << 3);
    if (phVar1 == (huffman_tree_node *)0x0) {
      return -1;
    }
    code->tree = phVar1;
    code->numallocatedentries = local_24;
  }
  code->tree[code->numentries].branches[0] = -1;
  code->tree[code->numentries].branches[1] = -2;
  return 1;
}

Assistant:

static int
new_node(struct huffman_code *code)
{
  void *new_tree;
  if (code->numallocatedentries == code->numentries) {
    int new_num_entries = 256;
    if (code->numentries > 0) {
        new_num_entries = code->numentries * 2;
    }
    new_tree = realloc(code->tree, new_num_entries * sizeof(*code->tree));
    if (new_tree == NULL)
        return (-1);
    code->tree = (struct huffman_tree_node *)new_tree;
    code->numallocatedentries = new_num_entries;
  }
  code->tree[code->numentries].branches[0] = -1;
  code->tree[code->numentries].branches[1] = -2;
  return 1;
}